

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void translateBrowsePathToNodeIds
               (UA_Server *server,UA_Session *session,UA_BrowsePath *path,
               UA_BrowsePathResult *result)

{
  UA_NodeStore *ns;
  size_t sVar1;
  UA_UInt16 *pUVar2;
  ulong uVar3;
  ulong uVar4;
  UA_Boolean UVar5;
  UA_StatusCode UVar6;
  UA_Byte *pUVar7;
  UA_NodeId *pUVar8;
  UA_NodeId *pUVar9;
  UA_NodeId *pUVar10;
  UA_String *pUVar11;
  UA_Node *pUVar12;
  long *plVar13;
  ulong uVar14;
  size_t r;
  ulong uVar15;
  UA_Server *pUVar16;
  long lVar17;
  int iVar18;
  UA_Byte *pUVar19;
  UA_ReferenceNode *n1;
  ulong uVar20;
  size_t i;
  UA_NodeId *pUVar21;
  UA_BrowsePath *pUVar22;
  bool bVar23;
  UA_NodeId *local_c0;
  UA_NodeId *reftypes;
  UA_Session *local_b0;
  ulong local_a8;
  UA_Server *local_a0;
  anon_union_16_4_621dfe33_for_identifier *local_98;
  UA_NodeId *local_90;
  ulong local_88;
  UA_Node *local_80;
  UA_NodeId *local_78;
  ulong local_70;
  UA_NodeId *local_68;
  UA_UInt16 *local_60;
  UA_NodeId *local_58;
  ulong local_50;
  UA_NodeId *local_48;
  UA_BrowsePath *local_40;
  char local_31;
  
  pUVar7 = (session->clientDescription).productUri.data;
  if (pUVar7 == (UA_Byte *)0x0) {
    *(undefined4 *)&path->startingNode = 0x800f0000;
    return;
  }
  plVar13 = (long *)((session->clientDescription).applicationName.locale.length + 0x28);
  while (bVar23 = pUVar7 != (UA_Byte *)0x0, pUVar7 = pUVar7 + -1, bVar23) {
    if (((short)plVar13[-1] == 0) && (*plVar13 == 0)) {
      *(undefined4 *)&path->startingNode = 0x80600000;
      return;
    }
    plVar13 = plVar13 + 7;
  }
  local_a0 = server;
  pUVar8 = (UA_NodeId *)malloc(0x230);
  (path->startingNode).identifier.string.data = (UA_Byte *)pUVar8;
  if (pUVar8 == (UA_NodeId *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
    return;
  }
  local_40 = path;
  pUVar9 = (UA_NodeId *)malloc(0xf0);
  if (pUVar9 == (UA_NodeId *)0x0) {
    *(undefined4 *)&local_40->startingNode = 0x80030000;
LAB_0011fc05:
    free(pUVar8);
    return;
  }
  pUVar10 = (UA_NodeId *)malloc(0xf0);
  if (pUVar10 == (UA_NodeId *)0x0) {
    *(undefined4 *)&local_40->startingNode = 0x80030000;
    free(pUVar8);
    pUVar8 = pUVar9;
    goto LAB_0011fc05;
  }
  local_68 = pUVar10;
  UVar6 = UA_NodeId_copy((UA_NodeId *)session,pUVar9);
  *(UA_StatusCode *)&local_40->startingNode = UVar6;
  if (UVar6 != 0) {
    free((local_40->startingNode).identifier.string.data);
    free(pUVar9);
    pUVar8 = local_68;
    goto LAB_0011fc05;
  }
  pUVar7 = (session->clientDescription).productUri.data;
  local_b0 = session;
  if (pUVar7 == (UA_Byte *)0x0) {
    __assert_fail("path->relativePath.elementsSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x5ade,
                  "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                 );
  }
  local_98 = &(local_40->startingNode).identifier;
  local_88 = 10;
  local_a8 = 10;
  local_60 = (UA_UInt16 *)0x0;
  pUVar19 = (UA_Byte *)0x0;
  uVar20 = 10;
  pUVar16 = local_a0;
  uVar15 = 1;
  local_78 = pUVar9;
  pUVar22 = local_40;
  while (uVar14 = uVar20, iVar18 = (int)pUVar19, pUVar19 < pUVar7) {
    pUVar8 = (UA_NodeId *)
             ((local_b0->clientDescription).applicationName.locale.length + (long)pUVar19 * 0x38);
    local_c0 = (UA_NodeId *)0x0;
    reftypes = (UA_NodeId *)0x1;
    local_31 = UA_NodeId_isNull(pUVar8);
    local_58 = pUVar8;
    if ((bool)local_31) {
      local_90 = (UA_NodeId *)0x0;
      pUVar9 = (UA_NodeId *)0x1;
LAB_0011fd32:
      pUVar11 = (UA_String *)(local_60 + 4);
      pUVar2 = &pUVar9->namespaceIndex;
      local_50 = 0;
      local_70 = uVar15;
      local_48 = pUVar9;
      for (uVar20 = 0; uVar15 = local_70, uVar20 != local_70; uVar20 = uVar20 + 1) {
        pUVar12 = UA_NodeStore_get(pUVar16->nodestore,local_78 + uVar20);
        pUVar8 = local_58;
        pUVar9 = local_48;
        if (pUVar12 == (UA_Node *)0x0) {
          if (iVar18 == 0) {
            *(undefined4 *)&pUVar22->startingNode = 0x80340000;
          }
        }
        else {
          local_80 = pUVar12;
          if ((local_60 == (UA_UInt16 *)0x0) ||
             ((*local_60 == (pUVar12->browseName).namespaceIndex &&
              (UVar5 = UA_String_equal(pUVar11,&(pUVar12->browseName).name), pUVar9 = local_48,
              UVar5)))) {
            uVar15 = 0;
            pUVar12 = local_80;
            pUVar9 = local_48;
            while ((pUVar16 = local_a0, uVar15 < pUVar12->referencesSize &&
                   (*(int *)&pUVar22->startingNode == 0))) {
              if (pUVar12->references[uVar15].isInverse ==
                  (UA_Boolean)(char)pUVar8[1].namespaceIndex) {
                n1 = pUVar12->references + uVar15;
                pUVar10 = local_90;
                pUVar21 = (UA_NodeId *)((long)pUVar2 + 1);
                if (local_31 == '\0') {
                  do {
                    pUVar12 = local_80;
                    pUVar9 = local_48;
                    pUVar8 = local_58;
                    pUVar22 = local_40;
                    if ((UA_NodeId *)((long)(pUVar21 + 0xffffffffffffffff) + 0x17U) ==
                        (UA_NodeId *)0x0) goto LAB_0011ff0c;
                    UVar5 = UA_NodeId_equal(&n1->referenceTypeId,pUVar10);
                    pUVar10 = pUVar10 + 1;
                    pUVar21 = (UA_NodeId *)((long)(pUVar21 + 0xffffffffffffffff) + 0x17U);
                  } while (!UVar5);
                }
                pUVar22 = local_40;
                uVar4 = local_88;
                uVar3 = local_a8;
                if ((n1->targetId).serverIndex == 0) {
                  if (local_88 <= local_50) {
                    pUVar8 = (UA_NodeId *)realloc(local_68,local_88 * 0x30);
                    if (pUVar8 == (UA_NodeId *)0x0) {
                      *(undefined4 *)&local_40->startingNode = 0x80030000;
                      pUVar12 = local_80;
                      pUVar9 = local_48;
                      pUVar8 = local_58;
                      pUVar22 = local_40;
                      goto LAB_0011ff0c;
                    }
                    local_88 = uVar4 * 2;
                    local_68 = pUVar8;
                  }
                  uVar3 = local_50;
                  pUVar8 = local_58;
                  UVar6 = UA_NodeId_copy(&(n1->targetId).nodeId,local_68 + local_50);
                  *(UA_StatusCode *)&local_40->startingNode = UVar6;
                  local_50 = uVar3 + 1;
                  pUVar12 = local_80;
                  pUVar9 = local_48;
                  pUVar22 = local_40;
                }
                else {
                  pUVar7 = (UA_Byte *)
                           realloc((local_40->startingNode).identifier.string.data,local_a8 * 0x70);
                  if (pUVar7 == (UA_Byte *)0x0) {
                    *(undefined4 *)&pUVar22->startingNode = 0x80030000;
                    pUVar12 = local_80;
                    pUVar9 = local_48;
                    pUVar8 = local_58;
                  }
                  else {
                    (pUVar22->startingNode).identifier.string.data = pUVar7;
                    local_a8 = uVar3 * 2;
                    UVar6 = UA_ExpandedNodeId_copy
                                      (&n1->targetId,
                                       (UA_ExpandedNodeId *)
                                       (pUVar7 + (pUVar22->startingNode).identifier.string.length *
                                                 0x38));
                    *(UA_StatusCode *)&pUVar22->startingNode = UVar6;
                    *(int *)((pUVar22->startingNode).identifier.string.data +
                            (pUVar22->startingNode).identifier.string.length * 0x38 + 0x30) = iVar18
                    ;
                    pUVar12 = local_80;
                    pUVar9 = local_48;
                    pUVar8 = local_58;
                  }
                }
              }
LAB_0011ff0c:
              uVar15 = uVar15 + 1;
            }
          }
        }
      }
      pUVar8 = local_78;
      if ((local_31 == '\0') && (*(char *)((long)&local_58[1].namespaceIndex + 1) == '\x01')) {
        UA_Array_delete(local_90,(size_t)pUVar9,UA_TYPES + 0x10);
        pUVar8 = local_78;
      }
    }
    else {
      pUVar9 = (UA_NodeId *)0x1;
      local_90 = pUVar8;
      if (*(char *)((long)&pUVar8[1].namespaceIndex + 1) != '\x01') goto LAB_0011fd32;
      ns = pUVar16->nodestore;
      pUVar12 = UA_NodeStore_get(ns,pUVar8);
      if (((pUVar12 != (UA_Node *)0x0) && (pUVar12->nodeClass == UA_NODECLASS_REFERENCETYPE)) &&
         (UVar6 = getTypeHierarchy(ns,pUVar12,false,&local_c0,(size_t *)&reftypes), UVar6 == 0)) {
        local_90 = local_c0;
        pUVar9 = reftypes;
        goto LAB_0011fd32;
      }
      local_50 = 0;
      pUVar8 = local_78;
    }
    while (bVar23 = uVar15 != 0, uVar15 = uVar15 - 1, bVar23) {
      UA_NodeId_deleteMembers(pUVar8);
      pUVar8 = pUVar8 + 1;
    }
    if (local_50 == 0) goto LAB_001200db;
    if (*(int *)&pUVar22->startingNode != 0) {
      __assert_fail("*nextCount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x5aed,
                    "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                   );
    }
    pUVar7 = (local_b0->clientDescription).productUri.data;
    local_60 = (UA_UInt16 *)
               ((local_b0->clientDescription).applicationName.locale.length + (long)pUVar19 * 0x38 +
               0x20);
    pUVar8 = local_78;
    uVar20 = local_88;
    uVar15 = local_50;
    local_78 = local_68;
    local_88 = uVar14;
    local_68 = pUVar8;
    pUVar19 = (UA_Byte *)(ulong)(iVar18 + 1);
  }
  if (local_60 == (UA_UInt16 *)0x0) {
    __assert_fail("targetName != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x5afa,
                  "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                 );
  }
  uVar20 = (local_98->string).length + uVar15;
  if (local_a8 < uVar20) {
    pUVar7 = (UA_Byte *)realloc((pUVar22->startingNode).identifier.string.data,uVar20 * 0x38);
    if (pUVar7 == (UA_Byte *)0x0) {
      *(undefined4 *)&pUVar22->startingNode = 0x80030000;
      pUVar8 = local_78;
      while (bVar23 = uVar15 != 0, uVar15 = uVar15 - 1, bVar23) {
        UA_NodeId_deleteMembers(pUVar8);
        pUVar8 = pUVar8 + 1;
      }
      goto LAB_001200db;
    }
    (pUVar22->startingNode).identifier.string.data = pUVar7;
  }
  pUVar11 = (UA_String *)(local_60 + 4);
  pUVar8 = local_78;
  while (bVar23 = uVar15 != 0, uVar15 = uVar15 - 1, pUVar22 = local_40, bVar23) {
    pUVar12 = UA_NodeStore_get(pUVar16->nodestore,pUVar8);
    if (((pUVar12 == (UA_Node *)0x0) || (*local_60 != (pUVar12->browseName).namespaceIndex)) ||
       (UVar5 = UA_String_equal(pUVar11,&(pUVar12->browseName).name), !UVar5)) {
      UA_NodeId_deleteMembers(pUVar8);
    }
    else {
      lVar17 = (local_40->startingNode).identifier.string.length * 0x38;
      pUVar19 = (local_40->startingNode).identifier.string.data;
      pUVar7 = pUVar19 + lVar17 + 0x20;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar7 = pUVar19 + lVar17 + 0x10;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar7 = pUVar19 + lVar17;
      pUVar7[0] = '\0';
      pUVar7[1] = '\0';
      pUVar7[2] = '\0';
      pUVar7[3] = '\0';
      pUVar7[4] = '\0';
      pUVar7[5] = '\0';
      pUVar7[6] = '\0';
      pUVar7[7] = '\0';
      pUVar7[8] = '\0';
      pUVar7[9] = '\0';
      pUVar7[10] = '\0';
      pUVar7[0xb] = '\0';
      pUVar7[0xc] = '\0';
      pUVar7[0xd] = '\0';
      pUVar7[0xe] = '\0';
      pUVar7[0xf] = '\0';
      pUVar19 = pUVar19 + lVar17 + 0x30;
      pUVar19[0] = '\0';
      pUVar19[1] = '\0';
      pUVar19[2] = '\0';
      pUVar19[3] = '\0';
      pUVar19[4] = '\0';
      pUVar19[5] = '\0';
      pUVar19[6] = '\0';
      pUVar19[7] = '\0';
      pUVar7 = (local_40->startingNode).identifier.string.data;
      lVar17 = (local_40->startingNode).identifier.string.length * 0x38;
      *(UA_Byte **)(pUVar7 + lVar17 + 0x10) = (pUVar8->identifier).string.data;
      sVar1 = (pUVar8->identifier).string.length;
      pUVar7 = pUVar7 + lVar17;
      *(undefined8 *)pUVar7 = *(undefined8 *)pUVar8;
      *(size_t *)(pUVar7 + 8) = sVar1;
      sVar1 = (local_40->startingNode).identifier.string.length;
      pUVar7 = (local_40->startingNode).identifier.string.data + sVar1 * 0x38 + 0x30;
      pUVar7[0] = 0xff;
      pUVar7[1] = 0xff;
      pUVar7[2] = 0xff;
      pUVar7[3] = 0xff;
      (local_40->startingNode).identifier.string.length = sVar1 + 1;
    }
    pUVar8 = pUVar8 + 1;
  }
LAB_001200db:
  if (((local_98->string).length == 0) && (*(int *)&pUVar22->startingNode == 0)) {
    *(undefined4 *)&pUVar22->startingNode = 0x806f0000;
  }
  free(local_78);
  free(local_68);
  if (*(int *)&pUVar22->startingNode != 0) {
    lVar17 = 0;
    for (uVar15 = 0; pUVar7 = (local_40->startingNode).identifier.string.data,
        uVar15 < (local_40->startingNode).identifier.string.length; uVar15 = uVar15 + 1) {
      UA_deleteMembers(pUVar7 + lVar17,UA_TYPES + 0x1a);
      lVar17 = lVar17 + 0x38;
    }
    free(pUVar7);
    (local_98->string).length = 0;
    (local_98->string).data = (UA_Byte *)0x0;
  }
  return;
}

Assistant:

static void
translateBrowsePathToNodeIds(UA_Server *server, UA_Session *session,
                             const UA_BrowsePath *path, UA_BrowsePathResult *result) {
    if(path->relativePath.elementsSize <= 0) {
        result->statusCode = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
        
    /* RelativePath elements must not have an empty targetName */
    for(size_t i = 0; i < path->relativePath.elementsSize; ++i) {
        if(UA_QualifiedName_isNull(&path->relativePath.elements[i].targetName)) {
            result->statusCode = UA_STATUSCODE_BADBROWSENAMEINVALID;
            return;
        }
    }

    /* Allocate memory for the targets */
    size_t targetsSize = 10; /* When to realloc; the member count is stored in
                              * result->targetsSize */
    result->targets = (UA_BrowsePathTarget*)UA_malloc(sizeof(UA_BrowsePathTarget) * targetsSize);
    if(!result->targets) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    /* Allocate memory for two temporary arrays. One with the results for the
     * previous depth of the path. The other for the new results at the current
     * depth. The two arrays alternate as we descend down the tree. */
    size_t currentSize = 10; /* When to realloc */
    size_t currentCount = 0; /* Current elements */
    UA_NodeId *current = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * currentSize);
    if(!current) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        return;
    }
    size_t nextSize = 10; /* When to realloc */
    size_t nextCount = 0; /* Current elements */
    UA_NodeId *next = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * nextSize);
    if(!next) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        UA_free(current);
        return;
    }

    /* Copy the starting node into current */
    result->statusCode = UA_NodeId_copy(&path->startingNode, &current[0]);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_free(result->targets);
        UA_free(current);
        UA_free(next);
        return;
    }
    currentCount = 1;

    /* Walk the path elements */
    walkBrowsePath(server, session, path, result, targetsSize,
                   &current, &currentSize, &currentCount,
                   &next, &nextSize, &nextCount);

    UA_assert(currentCount == 0);
    UA_assert(nextCount == 0);

    /* No results => BadNoMatch status code */
    if(result->targetsSize == 0 && result->statusCode == UA_STATUSCODE_GOOD)
        result->statusCode = UA_STATUSCODE_BADNOMATCH;

    /* Clean up the temporary arrays and the targets */
    UA_free(current);
    UA_free(next);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        for(size_t i = 0; i < result->targetsSize; ++i)
            UA_BrowsePathTarget_deleteMembers(&result->targets[i]);
        UA_free(result->targets);
        result->targets = NULL;
        result->targetsSize = 0;
    }
}